

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion QuaternionNormalize(Quaternion q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Quaternion QVar6;
  
  fVar4 = q.z;
  fVar5 = q.w;
  fVar1 = q.x;
  fVar3 = q.y;
  fVar2 = fVar5 * fVar5 + fVar4 * fVar4 + fVar1 * fVar1 + fVar3 * fVar3;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  QVar6.y = fVar3 * fVar2;
  QVar6.x = fVar1 * fVar2;
  QVar6.w = fVar2 * fVar5;
  QVar6.z = fVar4 * fVar2;
  return QVar6;
}

Assistant:

RMAPI Quaternion QuaternionNormalize(Quaternion q)
{
    Quaternion result = { 0 };

    float length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
    if (length == 0.0f) length = 1.0f;
    float ilength = 1.0f/length;

    result.x = q.x*ilength;
    result.y = q.y*ilength;
    result.z = q.z*ilength;
    result.w = q.w*ilength;

    return result;
}